

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::ModelDescription::ModelDescription
          (ModelDescription *this,ModelDescription *from)

{
  void *pvVar1;
  string *psVar2;
  Metadata *from_00;
  Metadata *this_00;
  
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__ModelDescription_003b9298;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  (this->input_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->input_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->input_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->input_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
            (&(this->input_).super_RepeatedPtrFieldBase,&(from->input_).super_RepeatedPtrFieldBase);
  (this->output_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->output_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->output_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->output_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
            (&(this->output_).super_RepeatedPtrFieldBase,&(from->output_).super_RepeatedPtrFieldBase
            );
  (this->traininginput_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->traininginput_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->traininginput_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->traininginput_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
            (&(this->traininginput_).super_RepeatedPtrFieldBase,
             &(from->traininginput_).super_RepeatedPtrFieldBase);
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  (this->predictedfeaturename_).ptr_ =
       (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  psVar2 = (from->predictedfeaturename_).ptr_;
  if ((psVar2 != (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) &&
     (psVar2->_M_string_length != 0)) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
              (&this->predictedfeaturename_,psVar2);
  }
  (this->predictedprobabilitiesname_).ptr_ =
       (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  psVar2 = (from->predictedprobabilitiesname_).ptr_;
  if ((psVar2 != (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) &&
     (psVar2->_M_string_length != 0)) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
              (&this->predictedprobabilitiesname_,psVar2);
  }
  from_00 = from->metadata_;
  if (from_00 == (Metadata *)0x0 || from == (ModelDescription *)&_ModelDescription_default_instance_
     ) {
    this_00 = (Metadata *)0x0;
  }
  else {
    this_00 = (Metadata *)operator_new(0x58);
    Metadata::Metadata(this_00,from_00);
  }
  this->metadata_ = this_00;
  return;
}

Assistant:

ModelDescription::ModelDescription(const ModelDescription& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      input_(from.input_),
      output_(from.output_),
      traininginput_(from.traininginput_),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  predictedfeaturename_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.predictedfeaturename().size() > 0) {
    predictedfeaturename_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.predictedfeaturename_);
  }
  predictedprobabilitiesname_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.predictedprobabilitiesname().size() > 0) {
    predictedprobabilitiesname_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.predictedprobabilitiesname_);
  }
  if (from.has_metadata()) {
    metadata_ = new ::CoreML::Specification::Metadata(*from.metadata_);
  } else {
    metadata_ = NULL;
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.ModelDescription)
}